

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosaraju_scc.cpp
# Opt level: O2

void __thiscall KosarajuSCC::_set_levels(KosarajuSCC *this,int start,int sink)

{
  key_type *__k;
  iterator *piVar1;
  pointer pvVar2;
  long lVar3;
  pointer piVar4;
  pointer piVar5;
  int iVar6;
  int iVar7;
  _Elt_pointer piVar8;
  uint *puVar9;
  mapped_type *pmVar10;
  int iVar11;
  size_type __n;
  uint uVar12;
  size_type sVar13;
  reference rVar14;
  allocator_type local_1a5;
  int edges;
  int local_1a0;
  uint local_19c;
  vector<bool,_std::allocator<bool>_> *local_198;
  int local_190;
  int local_18c;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  scc_graph_ends;
  queue<int,_std::deque<int,_std::allocator<int>_>_> topo;
  _Bvector_base<std::allocator<bool>_> local_108;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  scc_graph_out;
  int start_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  matrix;
  vector<bool,_std::allocator<bool>_> seen;
  stack<int,_std::deque<int,_std::allocator<int>_>_> s;
  
  iVar6 = (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[start];
  start_local = start;
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>(&s);
  std::deque<int,_std::allocator<int>_>::push_back(&s.c,&start_local);
  topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)0x0;
  topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map_size = 0
  ;
  topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start._M_cur
       = (_Elt_pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&scc_graph_out,
           (long)(int)(((long)(this->sccs).
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->sccs).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18),(value_type *)&topo,
           (allocator_type *)&seen);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&topo);
  scc_graph_ends.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scc_graph_ends.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  scc_graph_ends.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&topo,
             (long)(int)(((long)(this->sccs).
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->sccs).
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18),(bool *)&seen,
             (allocator_type *)&local_108);
  local_198 = &this->is_mand;
  std::vector<bool,_std::allocator<bool>_>::operator=
            (local_198,(vector<bool,_std::allocator<bool>_> *)&topo);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&topo);
  topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       ((ulong)topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
               _M_map & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&seen,(long)this->nb_nodes,(bool *)&topo,(allocator_type *)&local_108);
  sVar13 = (size_type)
           (int)(((long)(this->sccs).
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->sccs).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  local_108._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&topo,sVar13,(value_type_conflict1 *)&local_108,
             (allocator_type *)&edges);
  local_190 = iVar6;
  local_18c = sink;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&matrix,sVar13,(value_type *)&topo,(allocator_type *)&local_19c);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&topo);
  piVar1 = &topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_finish;
  topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map_size = 1
  ;
  topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start._M_cur
       = (_Elt_pointer)0x0;
  topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_first = (_Elt_pointer)0x0;
  topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_last = (_Elt_pointer)0x3f800000;
  topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_node = (_Map_pointer)0x0;
  topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_cur = (_Elt_pointer)0x0;
  topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map =
       &piVar1->_M_cur;
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::operator=(&(this->level2mandscc)._M_h,
              (_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&topo);
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&topo);
  topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map_size = 1
  ;
  topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start._M_cur
       = (_Elt_pointer)0x0;
  topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_first = (_Elt_pointer)0x0;
  topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_last = (_Elt_pointer)0x3f800000;
  topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_node = (_Map_pointer)0x0;
  topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_cur = (_Elt_pointer)0x0;
  topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map =
       &piVar1->_M_cur;
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::operator=(&(this->mandscc2somenode)._M_h,
              (_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&topo);
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&topo);
  edges = 0;
  local_1a0 = 0;
  while (s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
         _M_cur != s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                   _M_start._M_cur) {
    piVar8 = s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_cur;
    if (s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
        _M_cur == s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                  _M_finish._M_first) {
      piVar8 = s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
               _M_finish._M_node[-1] + 0x80;
    }
    uVar12 = piVar8[-1];
    sVar13 = (size_type)(int)uVar12;
    rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](&seen,sVar13);
    *rVar14._M_p = *rVar14._M_p | rVar14._M_mask;
    std::deque<int,_std::allocator<int>_>::pop_back(&s.c);
    iVar6 = (*this->_vptr_KosarajuSCC[4])(this,(ulong)uVar12);
    if (((char)iVar6 != '\0') &&
       (rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (local_198,
                            (long)(this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[sVar13]),
       (*rVar14._M_p & rVar14._M_mask) == 0)) {
      rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (local_198,
                          (long)(this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[sVar13]);
      *rVar14._M_p = *rVar14._M_p | rVar14._M_mask;
      topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map =
           (_Map_pointer)
           CONCAT44(topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_map._4_4_,
                    (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar13]);
      puVar9 = (uint *)std::__detail::
                       _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&this->mandscc2somenode,(key_type *)&topo);
      *puVar9 = uVar12;
      local_1a0 = local_1a0 + 1;
    }
    uVar12 = 0;
    while( true ) {
      pvVar2 = (this->outgoing).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = *(long *)&pvVar2[sVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data;
      if ((ulong)((long)pvVar2[sVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - lVar3 >> 2) <= (ulong)uVar12) break;
      topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map =
           (_Map_pointer)
           CONCAT44(topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_map._4_4_,
                    *(undefined4 *)
                     (*(long *)&(this->ends).
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start
                                [*(int *)(lVar3 + (ulong)uVar12 * 4)].
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data + 4));
      iVar6 = (*this->_vptr_KosarajuSCC[2])(this);
      if (((char)iVar6 == '\0') &&
         (iVar6 = (*this->_vptr_KosarajuSCC[3])
                            (this,(ulong)topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl
                                         .super__Deque_impl_data._M_map & 0xffffffff),
         (char)iVar6 == '\0')) {
        piVar4 = (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar6 = piVar4[sVar13];
        __n = (size_type)
              (int)topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                   super__Deque_impl_data._M_map;
        iVar7 = piVar4[__n];
        if ((iVar6 != iVar7) &&
           (matrix.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar6].
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [iVar7] == 0)) {
          std::vector<int,_std::allocator<int>_>::push_back
                    (scc_graph_out.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar6,&edges);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::emplace_back<>(&scc_graph_ends);
          local_108._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_ =
               (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[sVar13];
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    (scc_graph_ends.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1,(int *)&local_108);
          local_108._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_ =
               (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(int)topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_map];
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    (scc_graph_ends.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1,(int *)&local_108);
          edges = edges + 1;
          piVar4 = (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          matrix.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[piVar4[sVar13]].
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [piVar4[(int)topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_map]] = 1;
          __n = (size_type)
                (int)topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_map;
        }
        rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](&seen,__n);
        if ((*rVar14._M_p & rVar14._M_mask) == 0) {
          std::deque<int,_std::allocator<int>_>::push_back(&s.c,(value_type_conflict1 *)&topo);
        }
      }
      uVar12 = uVar12 + 1;
    }
  }
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>(&topo);
  local_19c = local_19c & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_108,
             (long)(int)(((long)(this->sccs).
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->sccs).
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18),(bool *)&local_19c
             ,&local_1a5);
  iVar7 = local_18c;
  iVar6 = local_190;
  std::vector<bool,_std::allocator<bool>_>::operator=
            (&seen,(vector<bool,_std::allocator<bool>_> *)&local_108);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_108);
  topological_sort(this,iVar6,&scc_graph_out,&scc_graph_ends,&topo,&seen);
  iVar6 = (int)(((long)(this->sccs).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->sccs).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  local_19c = iVar6 + 10;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_108,(long)iVar6,
             (value_type_conflict1 *)&local_19c,(allocator_type *)&local_1a5);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->levels,&local_108);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_108);
  (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[(this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start[iVar7]] = local_1a0;
  while (topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
         _M_finish._M_cur !=
         topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start
         ._M_cur) {
    iVar6 = *topo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_start._M_cur;
    std::deque<int,_std::allocator<int>_>::pop_front(&topo.c);
    piVar4 = (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar7 = (int)(((long)(this->sccs).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->sccs).
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) + 10;
    sVar13 = (size_type)iVar6;
    piVar5 = scc_graph_out.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[sVar13].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    for (uVar12 = 0;
        (ulong)uVar12 <
        (ulong)((long)scc_graph_out.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[sVar13].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_finish - (long)piVar5 >> 2); uVar12 = uVar12 + 1) {
      if (piVar4[scc_graph_ends.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[piVar5[uVar12]].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[1]] <= iVar7) {
        iVar7 = piVar4[scc_graph_ends.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[piVar5[uVar12]].
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[1]];
      }
    }
    iVar11 = piVar4[sVar13];
    if (iVar7 < piVar4[sVar13]) {
      iVar11 = iVar7;
    }
    piVar4[sVar13] = iVar11;
    rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](local_198,sVar13);
    if ((*rVar14._M_p & rVar14._M_mask) != 0) {
      __k = (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + sVar13;
      *__k = *__k + -1;
      pmVar10 = std::__detail::
                _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->level2mandscc,__k);
      *pmVar10 = iVar6;
    }
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&topo);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&matrix);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&seen.super__Bvector_base<std::allocator<bool>_>);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&scc_graph_ends);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&scc_graph_out);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&s);
  return;
}

Assistant:

void KosarajuSCC::_set_levels(int start, int sink) {
	const int start_scc = scc_of(start);
	std::stack<int> s;
	s.push(start);

	std::vector<std::vector<int> > scc_graph_out =
			std::vector<std::vector<int> >(nb_sccs(), std::vector<int>());
	std::vector<std::vector<int> > scc_graph_ends;
	is_mand = std::vector<bool>(nb_sccs(), false);
	std::vector<bool> seen = std::vector<bool>(nb_nodes, false);
	std::vector<std::vector<int> > matrix =
			std::vector<std::vector<int> >(nb_sccs(), std::vector<int>(nb_sccs(), 0));

	level2mandscc = std::unordered_map<int, int>();
	mandscc2somenode = std::unordered_map<int, int>();
	int edges = 0;
	int mand_sccs = 0;
	while (!s.empty()) {
		const int u = s.top();
		seen[u] = true;
		s.pop();
		if (mandatory_node(u) && !is_mand[scc_of(u)]) {
			is_mand[scc_of(u)] = true;
			mandscc2somenode[scc_of(u)] = u;
			mand_sccs++;
		}
		for (unsigned int i = 0; i < outgoing[u].size(); ++i) {
			const int e = outgoing[u][i];
			const int v = ends[e][1];
			if (ignore_edge(e) || ignore_node(v)) {
				continue;
			}
			if (scc_of(u) != scc_of(v) && matrix[scc_of(u)][scc_of(v)] == 0) {
				scc_graph_out[scc_of(u)].push_back(edges);
				scc_graph_ends.emplace_back();
				scc_graph_ends.back().push_back(scc_of(u));
				scc_graph_ends.back().push_back(scc_of(v));
				edges++;
				matrix[scc_of(u)][scc_of(v)] = 1;
			}
			if (!seen[v]) {
				s.push(v);
			}
		}
	}
	/*std::cout<<"\n";
		std::cout<<"SCC GRAPH"<<std::endl;
		for (int i = 0; i < scc_graph_out.size(); i++) {
		for (int j = 0; j < scc_graph_out[i].size(); j++) {
		std::cout<<scc_graph_out[i][j]<<"(to "
		<<scc_graph_ends[scc_graph_out[i][j]][1]<<") ";
		}
		std::cout<<std::endl;
		}
		std::cout<<std::endl;
		std::cout<<"MANDS ";
		for (int i = 0; i < nb_sccs(); i++) {
		std::cout<<is_mand[i]<<" ";
		}
		std::cout<<std::endl;
		//*/
	std::queue<int> topo;
	seen = std::vector<bool>(nb_sccs(), false);
	topological_sort(start_scc, scc_graph_out, scc_graph_ends, topo, seen);

	levels = std::vector<int>(nb_sccs(), nb_sccs() + 10);
	levels[scc_of(sink)] = mand_sccs;

	while (!topo.empty()) {
		const int u = topo.front();
		topo.pop();
		int min = nb_sccs() + 10;
		// std::cout<<"Looking at "<<u<<std::endl;
		for (unsigned int i = 0; i < scc_graph_out[u].size(); ++i) {
			const int e = scc_graph_out[u][i];
			const int v = scc_graph_ends[e][1];
			min = (min < levels[v]) ? min : levels[v];
		}
		levels[u] = (min < levels[u]) ? min : levels[u];
		if (is_mand[u]) {
			levels[u] -= 1;
			level2mandscc[levels[u]] = u;
		}
	}
	/*std::cout<<"LEVELS: "<<mand_sccs<<"     ";
		for (int i = 0; i < nb_sccs(); i++)
		std::cout<<levels[i]<<" ";
		std::cout<<std::endl;
	*/
}